

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O3

bool anon_unknown.dwarf_128b92::save
               (char *filename,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *cmap)

{
  undefined1 uVar1;
  ostream *poVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  ofstream ofs;
  die local_229;
  long local_228;
  filebuf local_220 [24];
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,filename,_S_out);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ofs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"permission denied: ",0x13);
    if (filename == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,filename,sVar3);
    }
    MeCab::die::~die(&local_229);
  }
  p_Var4 = (cmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(cmap->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_228,p_Var4[2]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_220);
  uVar1 = std::ios_base::~ios_base(local_130);
  return (bool)uVar1;
}

Assistant:

bool save(const char* filename,
          std::map<std::string, int> *cmap) {
  std::ofstream ofs(WPATH(filename));
  CHECK_DIE(ofs) << "permission denied: " << filename;
  for (std::map<std::string, int>::const_iterator it = cmap->begin();
       it != cmap->end(); ++it) {
    ofs << it->second << " " << it->first << std::endl;
  }
  return true;
}